

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback-queue.cc
# Opt level: O3

void __thiscall capture_thread::testing::CallbackQueue::WaitUntilEmpty(CallbackQueue *this)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_owns = false;
  local_28._M_device = &this->queue_lock_;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if (this->terminated_ == false) {
    do {
      if (((this->queue_).c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur ==
           (this->queue_).c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur) && (this->pending_ < 1)) break;
      std::condition_variable::wait((unique_lock *)&this->condition_);
    } while (this->terminated_ != true);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void CallbackQueue::WaitUntilEmpty() {
  std::unique_lock<std::mutex> lock(queue_lock_);
  while (!terminated_ && (!queue_.empty() || pending_ > 0)) {
    condition_.wait(lock);
  }
}